

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5NextMethod(sqlite3_vtab_cursor *pCursor)

{
  uint uVar1;
  int local_28;
  int local_24;
  int bSkip;
  int rc;
  Fts5Cursor *pCsr;
  sqlite3_vtab_cursor *pCursor_local;
  
  _bSkip = (Fts5Cursor *)pCursor;
  pCsr = (Fts5Cursor *)pCursor;
  if (*(int *)&pCursor[4].pVtab < 3) {
    local_28 = 0;
    local_24 = fts5CursorReseek((Fts5Cursor *)pCursor,&local_28);
    if (local_24 != 0) {
      return local_24;
    }
    if (local_28 != 0) {
      return 0;
    }
    local_24 = sqlite3Fts5ExprNext(_bSkip->pExpr,_bSkip->iLastRowid);
    uVar1 = sqlite3Fts5ExprEof(_bSkip->pExpr);
    _bSkip->csrflags = uVar1 | _bSkip->csrflags;
    fts5CsrNewrow(_bSkip);
  }
  else if (*(int *)&pCursor[4].pVtab == 3) {
    *(uint *)&pCursor[10].pVtab = *(uint *)&pCursor[10].pVtab | 1;
    local_24 = 0;
  }
  else if (*(int *)&pCursor[4].pVtab == 4) {
    local_24 = fts5SorterNext((Fts5Cursor *)pCursor);
  }
  else {
    local_24 = sqlite3_step((sqlite3_stmt *)pCursor[7].pVtab);
    if (local_24 == 100) {
      local_24 = 0;
    }
    else {
      *(uint *)&((sqlite3_vtab_cursor *)((long)_bSkip + 0x50))->pVtab =
           *(uint *)&((sqlite3_vtab_cursor *)((long)_bSkip + 0x50))->pVtab | 1;
      local_24 = sqlite3_reset((sqlite3_stmt *)((sqlite3_vtab_cursor *)((long)_bSkip + 0x38))->pVtab
                              );
    }
  }
  return local_24;
}

Assistant:

static int fts5NextMethod(sqlite3_vtab_cursor *pCursor){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCursor;
  int rc;

  assert( (pCsr->ePlan<3)==
          (pCsr->ePlan==FTS5_PLAN_MATCH || pCsr->ePlan==FTS5_PLAN_SOURCE) 
  );
  assert( !CsrFlagTest(pCsr, FTS5CSR_EOF) );

  if( pCsr->ePlan<3 ){
    int bSkip = 0;
    if( (rc = fts5CursorReseek(pCsr, &bSkip)) || bSkip ) return rc;
    rc = sqlite3Fts5ExprNext(pCsr->pExpr, pCsr->iLastRowid);
    CsrFlagSet(pCsr, sqlite3Fts5ExprEof(pCsr->pExpr));
    fts5CsrNewrow(pCsr);
  }else{
    switch( pCsr->ePlan ){
      case FTS5_PLAN_SPECIAL: {
        CsrFlagSet(pCsr, FTS5CSR_EOF);
        rc = SQLITE_OK;
        break;
      }
  
      case FTS5_PLAN_SORTED_MATCH: {
        rc = fts5SorterNext(pCsr);
        break;
      }
  
      default:
        rc = sqlite3_step(pCsr->pStmt);
        if( rc!=SQLITE_ROW ){
          CsrFlagSet(pCsr, FTS5CSR_EOF);
          rc = sqlite3_reset(pCsr->pStmt);
        }else{
          rc = SQLITE_OK;
        }
        break;
    }
  }
  
  return rc;
}